

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

int llex(LexState *ls,SemInfo *seminfo)

{
  size_t *psVar1;
  ZIO *pZVar2;
  size_t __n;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  TString *pTVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  long lVar12;
  uint c;
  ulong x;
  Mbuffer *pMVar13;
  bool bVar14;
  char local_38 [8];
  
  ls->buff->n = 0;
LAB_001430db:
  uVar4 = ls->current;
  switch(uVar4) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x3b:
  case 0x3f:
    goto switchD_001430f2_caseD_0;
  case 9:
  case 0xb:
  case 0xc:
  case 0x20:
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    goto LAB_001430db;
  case 10:
  case 0xd:
    inclinenumber(ls);
    goto LAB_001430db;
  case 0x22:
  case 0x27:
    save(ls,uVar4);
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
    goto LAB_001433b0;
  case 0x2d:
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    if (uVar4 != 0x2d) {
      return 0x2d;
    }
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    if (uVar4 == 0x5b) {
      sVar9 = skip_sep(ls);
      ls->buff->n = 0;
      if (sVar9 < 2) {
        uVar4 = ls->current;
        goto LAB_001431cc;
      }
      read_long_string(ls,(SemInfo *)0x0,sVar9);
      ls->buff->n = 0;
    }
    else {
LAB_001431cc:
      while ((0xe < uVar4 + 1 || ((0x4801U >> (uVar4 + 1 & 0x1f) & 1) == 0))) {
        pZVar2 = ls->z;
        sVar9 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar9 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
      }
    }
    goto LAB_001430db;
  case 0x2e:
    save(ls,0x2e);
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar7 = check_next1(ls,0x2e);
    if (iVar7 != 0) {
      iVar7 = check_next1(ls,0x2e);
      return 0x11a - (uint)(iVar7 == 0);
    }
    if ((""[(long)ls->current + 1] & 2) == 0) {
      return 0x2e;
    }
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    iVar7 = read_numeral(ls,seminfo);
    return iVar7;
  case 0x2f:
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar6 = 0x2f;
    iVar7 = check_next1(ls,0x2f);
    bVar14 = iVar7 == 0;
    iVar7 = 0x118;
    break;
  case 0x3a:
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar6 = 0x3a;
    iVar7 = check_next1(ls,0x3a);
    bVar14 = iVar7 == 0;
    iVar7 = 0x121;
    break;
  case 0x3c:
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar7 = check_next1(ls,0x3d);
    if (iVar7 != 0) {
      return 0x11d;
    }
    iVar6 = 0x3c;
    iVar7 = check_next1(ls,0x3c);
    bVar14 = iVar7 == 0;
    iVar7 = 0x11f;
    break;
  case 0x3d:
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar6 = 0x3d;
    iVar7 = check_next1(ls,0x3d);
    bVar14 = iVar7 == 0;
    iVar7 = 0x11b;
    break;
  case 0x3e:
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar7 = check_next1(ls,0x3d);
    if (iVar7 != 0) {
      return 0x11c;
    }
    iVar6 = 0x3e;
    iVar7 = check_next1(ls,0x3e);
    bVar14 = iVar7 == 0;
    iVar7 = 0x120;
    break;
  case 0x40:
    iVar7 = 0x40;
    save(ls,0x40);
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    while (ls->current = uVar4, (""[(long)(int)uVar4 + 1] & 3) != 0) {
      save(ls,uVar4);
      pZVar2 = ls->z;
      sVar9 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar9 == 0) {
        uVar4 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar4 = (uint)*pbVar3;
      }
    }
    check_save_next1(ls,0x5b);
    check_save_next1(ls,0x5d);
    pMVar13 = ls->buff;
    pcVar11 = pMVar13->buffer;
    __n = pMVar13->n;
    iVar6 = strncmp(pcVar11,"@integer",__n);
    sVar10 = __n;
    if (iVar6 == 0) {
      iVar7 = 0x127;
    }
    else {
      iVar6 = strncmp(pcVar11,"@integer[]",__n);
      if (iVar6 == 0) {
        iVar7 = 0x129;
      }
      else {
        iVar6 = strncmp(pcVar11,"@number",__n);
        if (iVar6 == 0) {
          iVar7 = 0x128;
        }
        else {
          iVar6 = strncmp(pcVar11,"@number[]",__n);
          if (iVar6 == 0) {
            iVar7 = 0x12a;
          }
          else {
            iVar6 = strncmp(pcVar11,"@table",__n);
            if (iVar6 == 0) {
              iVar7 = 299;
            }
            else {
              iVar6 = strncmp(pcVar11,"@string",__n);
              if (iVar6 == 0) {
                iVar7 = 300;
              }
              else {
                iVar6 = strncmp(pcVar11,"@closure",__n);
                if (iVar6 == 0) {
                  iVar7 = 0x12d;
                }
                else {
                  pTVar8 = luaX_newstring(ls,pcVar11 + 1,__n - 1);
                  seminfo->ts = pTVar8;
                  pMVar13 = ls->buff;
                  sVar10 = pMVar13->n;
                }
              }
            }
          }
        }
      }
    }
    pMVar13->n = sVar10 - __n;
    return iVar7;
  case 0xffffffff:
    return 0x122;
  default:
    if (uVar4 != 0x5b) {
      if (uVar4 == 0x7e) {
        pZVar2 = ls->z;
        sVar9 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar9 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
        iVar7 = check_next1(ls,0x3d);
        if (iVar7 != 0) {
          return 0x11e;
        }
        return 0x7e;
      }
switchD_001430f2_caseD_0:
      if ((""[(long)(int)uVar4 + 1] & 1) == 0) {
        pZVar2 = ls->z;
        sVar9 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar9 == 0) {
          uVar5 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar5 = (uint)*pbVar3;
        }
        ls->current = uVar5;
        return uVar4;
      }
      do {
        save(ls,uVar4);
        pZVar2 = ls->z;
        sVar9 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar9 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
      } while ((""[(long)(int)uVar4 + 1] & 3) != 0);
      pTVar8 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
      seminfo->ts = pTVar8;
      if (pTVar8->tt != '\x04') {
        return 0x125;
      }
      if (pTVar8->extra == 0) {
        return 0x125;
      }
      return pTVar8->extra | 0x100;
    }
    sVar9 = skip_sep(ls);
    if (1 < sVar9) {
      read_long_string(ls,seminfo,sVar9);
      return 0x126;
    }
    if (sVar9 != 0) {
      return 0x5b;
    }
    pcVar11 = "invalid long string delimiter";
    goto LAB_00143b78;
  }
  if (!bVar14) {
    return iVar7;
  }
  return iVar6;
LAB_001433b0:
  if (uVar5 == uVar4) {
    save(ls,uVar4);
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    pTVar8 = luaX_newstring(ls,ls->buff->buffer + 1,ls->buff->n - 2);
    seminfo->ts = pTVar8;
    return 0x126;
  }
  if (uVar5 != 0x5c) {
    if ((uVar5 == 0xd) || (uVar5 == 10)) {
      pcVar11 = "unfinished string";
LAB_00143b78:
      iVar7 = 0x126;
    }
    else {
      if (uVar5 != 0xffffffff) {
        save(ls,uVar5);
        pZVar2 = ls->z;
        sVar9 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar9 == 0) {
          uVar5 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar5 = (uint)*pbVar3;
        }
        ls->current = uVar5;
        goto LAB_0014362d;
      }
      pcVar11 = "unfinished string";
      iVar7 = 0x122;
    }
    lexerror(ls,pcVar11,iVar7);
  }
  save(ls,0x5c);
  pZVar2 = ls->z;
  sVar9 = pZVar2->n;
  pZVar2->n = pZVar2->n - 1;
  if (sVar9 == 0) {
    uVar5 = luaZ_fill(pZVar2);
  }
  else {
    pbVar3 = (byte *)pZVar2->p;
    pZVar2->p = (char *)(pbVar3 + 1);
    uVar5 = (uint)*pbVar3;
  }
  ls->current = uVar5;
  switch(uVar5) {
  case 0x6e:
    c = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x77:
  case 0x79:
switchD_00143490_caseD_6f:
    esccheck(ls,""[(long)(int)uVar5 + 1] & 2,"invalid escape sequence");
    lVar12 = 0;
    c = 0;
    while (((int)lVar12 != 3 && (iVar7 = ls->current, (""[(long)iVar7 + 1] & 2) != 0))) {
      save(ls,iVar7);
      pZVar2 = ls->z;
      sVar9 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar9 == 0) {
        uVar5 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      ls->current = uVar5;
      lVar12 = lVar12 + 1;
      c = c * 10 + -0x30 + iVar7;
    }
    esccheck(ls,(uint)((int)c < 0x100),"decimal escape too large");
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - lVar12;
    goto LAB_0014361a;
  case 0x72:
    c = 0xd;
    break;
  case 0x74:
    c = 9;
    break;
  case 0x75:
    save(ls,0x75);
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
    esccheck(ls,(uint)(uVar5 == 0x7b),"missing \'{\'");
    iVar7 = gethexa(ls);
    x = (ulong)iVar7;
    lVar12 = -4;
    while( true ) {
      save(ls,ls->current);
      pZVar2 = ls->z;
      sVar9 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar9 == 0) {
        uVar5 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      ls->current = uVar5;
      if ((""[(long)(int)uVar5 + 1] & 0x10) == 0) break;
      esccheck(ls,(uint)(x < 0x8000000),"UTF-8 value too large");
      iVar7 = luaO_hexavalue(ls->current);
      lVar12 = lVar12 + -1;
      x = x * 0x10 + (long)iVar7;
    }
    esccheck(ls,(uint)(uVar5 == 0x7d),"missing \'}\'");
    pZVar2 = ls->z;
    sVar9 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar9 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 + lVar12;
    iVar7 = luaO_utf8esc(local_38,x);
    lVar12 = (long)iVar7;
    pcVar11 = &stack0xffffffffffffffd0 + -lVar12;
    for (; 0 < lVar12; lVar12 = lVar12 + -1) {
      save(ls,(int)*pcVar11);
      pcVar11 = pcVar11 + 1;
    }
    goto LAB_0014362d;
  case 0x76:
    c = 0xb;
    break;
  case 0x78:
    iVar7 = gethexa(ls);
    iVar6 = gethexa(ls);
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - 2;
    c = iVar6 + iVar7 * 0x10;
    break;
  case 0x7a:
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - 1;
    do {
      pZVar2 = ls->z;
      sVar9 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar9 == 0) {
        uVar5 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      ls->current = uVar5;
      while( true ) {
        if ((""[(long)(int)uVar5 + 1] & 8) == 0) goto LAB_0014362d;
        if ((uVar5 != 0xd) && (uVar5 != 10)) break;
        inclinenumber(ls);
        uVar5 = ls->current;
      }
    } while( true );
  default:
    if (uVar5 != 0xffffffff) {
      if ((uVar5 != 10) && (uVar5 != 0xd)) {
        c = uVar5;
        if ((uVar5 != 0x22) && (((uVar5 != 0x27 && (uVar5 != 0x5c)) && (c = 7, uVar5 != 0x61)))) {
          if (uVar5 == 0x66) {
            c = 0xc;
          }
          else {
            if (uVar5 != 0x62) goto switchD_00143490_caseD_6f;
            c = 8;
          }
        }
        break;
      }
      inclinenumber(ls);
      c = 10;
      goto LAB_0014361a;
    }
    goto LAB_0014362d;
  }
  pZVar2 = ls->z;
  sVar9 = pZVar2->n;
  pZVar2->n = pZVar2->n - 1;
  if (sVar9 == 0) {
    uVar5 = luaZ_fill(pZVar2);
  }
  else {
    pbVar3 = (byte *)pZVar2->p;
    pZVar2->p = (char *)(pbVar3 + 1);
    uVar5 = (uint)*pbVar3;
  }
  ls->current = uVar5;
LAB_0014361a:
  psVar1 = &ls->buff->n;
  *psVar1 = *psVar1 - 1;
  save(ls,c);
LAB_0014362d:
  uVar5 = ls->current;
  goto LAB_001433b0;
}

Assistant:

static int llex (LexState *ls, SemInfo *seminfo) {
  luaZ_resetbuffer(ls->buff);
  for (;;) {
    switch (ls->current) {
      case '\n': case '\r': {  /* line breaks */
        inclinenumber(ls);
        break;
      }
      case ' ': case '\f': case '\t': case '\v': {  /* spaces */
        next(ls);
        break;
      }
      case '-': {  /* '-' or '--' (comment) */
        next(ls);
        if (ls->current != '-') return '-';
        /* else is a comment */
        next(ls);
        if (ls->current == '[') {  /* long comment? */
          size_t sep = skip_sep(ls);
          luaZ_resetbuffer(ls->buff);  /* 'skip_sep' may dirty the buffer */
          if (sep >= 2) {
            read_long_string(ls, NULL, sep);  /* skip long comment */
            luaZ_resetbuffer(ls->buff);  /* previous call may dirty the buff. */
            break;
          }
        }
        /* else short comment */
        while (!currIsNewline(ls) && ls->current != EOZ)
          next(ls);  /* skip until end of line (or end of file) */
        break;
      }
      case '[': {  /* long string or simply '[' */
        size_t sep = skip_sep(ls);
        if (sep >= 2) {
          read_long_string(ls, seminfo, sep);
          return TK_STRING;
        }
        else if (sep == 0)  /* '[=...' missing second bracket? */
          lexerror(ls, "invalid long string delimiter", TK_STRING);
        return '[';
      }
      case '=': {
        next(ls);
        if (check_next1(ls, '=')) return TK_EQ;
        else return '=';
      }
      case '<': {
        next(ls);
        if (check_next1(ls, '=')) return TK_LE;
        else if (check_next1(ls, '<')) return TK_SHL;
        else return '<';
      }
      case '>': {
        next(ls);
        if (check_next1(ls, '=')) return TK_GE;
        else if (check_next1(ls, '>')) return TK_SHR;
        else return '>';
      }
      case '/': {
        next(ls);
        if (check_next1(ls, '/')) return TK_IDIV;
        else return '/';
      }
      case '~': {
        next(ls);
        if (check_next1(ls, '=')) return TK_NE;
        else return '~';
      }
      case ':': {
        next(ls);
        if (check_next1(ls, ':')) return TK_DBCOLON;
        else return ':';
      }
      case '"': case '\'': {  /* short literal strings */
        read_string(ls, ls->current, seminfo);
        return TK_STRING;
      }
      case '.': {  /* '.', '..', '...', or number */
        save_and_next(ls);
        if (check_next1(ls, '.')) {
          if (check_next1(ls, '.'))
            return TK_DOTS;   /* '...' */
          else return TK_CONCAT;   /* '..' */
        }
        else if (!lisdigit(ls->current)) return '.';
        else return read_numeral(ls, seminfo);
      }
      case '0': case '1': case '2': case '3': case '4':
      case '5': case '6': case '7': case '8': case '9': {
        return read_numeral(ls, seminfo);
      }
      case EOZ: {
        return TK_EOS;
      }
      case '@': {
        /* RAVI change: @ introduces a type assertion operator */
        save_and_next(ls);
        while (lislalnum(ls->current)) {
          save_and_next(ls);
        }
        check_save_next1(ls, '[');
        check_save_next1(ls, ']');
        return casttoken(ls, seminfo);
      }
      default: {
        if (lislalpha(ls->current)) {  /* identifier or reserved word? */
          TString *ts;
          do {
            save_and_next(ls);
          } while (lislalnum(ls->current));
          ts = luaX_newstring(ls, luaZ_buffer(ls->buff),
                                  luaZ_bufflen(ls->buff));
          seminfo->ts = ts;
          if (isreserved(ts))  /* reserved word? */
            return ts->extra - 1 + FIRST_RESERVED;
          else {
            return TK_NAME;
          }
        }
        else {  /* single-char tokens (+ - / ...) */
          int c = ls->current;
          next(ls);
          return c;
        }
      }
    }
  }
}